

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_ldst_multiple(DisasContext_conflict6 *ctx,uint32_t opc,int reglist,int base,int16_t offset)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGv_i64 addr;
  TCGv_i64 arg3;
  TCGv_i32 arg4;
  TCGv_i32 t2;
  TCGv_i64 t1;
  TCGv_i64 t0;
  TCGContext_conflict6 *tcg_ctx;
  int16_t offset_local;
  int base_local;
  int reglist_local;
  uint32_t opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->hflags & 0x87f800) == 0) {
    addr = tcg_temp_new_i64(tcg_ctx_00);
    gen_base_offset_addr(ctx,addr,base,(int)offset);
    arg3 = tcg_const_i64_mips64el(tcg_ctx_00,(long)reglist);
    arg4 = tcg_const_i32_mips64el(tcg_ctx_00,ctx->mem_idx);
    save_cpu_state(ctx,1);
    switch(opc) {
    case 5:
      gen_helper_lwm(tcg_ctx_00,tcg_ctx_00->cpu_env,addr,arg3,arg4);
      break;
    case 7:
      gen_helper_ldm(tcg_ctx_00,tcg_ctx_00->cpu_env,addr,arg3,arg4);
      break;
    case 0xd:
      gen_helper_swm(tcg_ctx_00,tcg_ctx_00->cpu_env,addr,arg3,arg4);
      break;
    case 0xf:
      gen_helper_sdm(tcg_ctx_00,tcg_ctx_00->cpu_env,addr,arg3,arg4);
    }
    tcg_temp_free_i64(tcg_ctx_00,addr);
    tcg_temp_free_i64(tcg_ctx_00,arg3);
    tcg_temp_free_i32(tcg_ctx_00,arg4);
  }
  else {
    generate_exception_end(ctx,0x14);
  }
  return;
}

Assistant:

static void gen_ldst_multiple(DisasContext *ctx, uint32_t opc, int reglist,
                              int base, int16_t offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1;
    TCGv_i32 t2;

    if (ctx->hflags & MIPS_HFLAG_BMASK) {
        generate_exception_end(ctx, EXCP_RI);
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);

    gen_base_offset_addr(ctx, t0, base, offset);

    t1 = tcg_const_tl(tcg_ctx, reglist);
    t2 = tcg_const_i32(tcg_ctx, ctx->mem_idx);

    save_cpu_state(ctx, 1);
    switch (opc) {
    case LWM32:
        gen_helper_lwm(tcg_ctx, tcg_ctx->cpu_env, t0, t1, t2);
        break;
    case SWM32:
        gen_helper_swm(tcg_ctx, tcg_ctx->cpu_env, t0, t1, t2);
        break;
#ifdef TARGET_MIPS64
    case LDM:
        gen_helper_ldm(tcg_ctx, tcg_ctx->cpu_env, t0, t1, t2);
        break;
    case SDM:
        gen_helper_sdm(tcg_ctx, tcg_ctx->cpu_env, t0, t1, t2);
        break;
#endif
    }
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free_i32(tcg_ctx, t2);
}